

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::Reflection::AddMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  MapFieldBase *this_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *pVVar5;
  MessageLite *pMVar6;
  Descriptor *pDVar7;
  undefined4 extraout_var;
  MessageLite *extraout_RAX;
  char *description;
  Arena *arena;
  Metadata MVar8;
  
  MVar8 = Message::GetMetadata(message);
  if (MVar8.reflection != this) {
    pDVar7 = this->descriptor_;
    MVar8 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar7,MVar8.descriptor,field,"AddMessage");
  }
  pDVar7 = this->descriptor_;
  if (field->containing_type_ != pDVar7) {
    description = "Field does not match message type.";
LAB_0025b663:
    anon_unknown_6::ReportReflectionUsageError(pDVar7,field,"AddMessage",description);
  }
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
    if ((bVar1 & 0x20) == 0) {
      description = "Field is singular; the method requires a repeated field.";
      goto LAB_0025b663;
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
      anon_unknown_6::ReportReflectionUsageTypeError(pDVar7,field,"AddMessage",CPPTYPE_MESSAGE);
    }
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    if ((bVar1 & 8) != 0) {
      uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
      pMVar6 = internal::ExtensionSet::AddMessage
                         ((ExtensionSet *)
                          ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                          field,factory);
      return (Message *)pMVar6;
    }
    if ((field->type_ == 0xb) && (bVar2 = FieldDescriptor::is_map_message_type(field), bVar2)) {
      VerifyFieldType<google::protobuf::internal::MapFieldBase>(this,field);
      this_00 = (MapFieldBase *)MutableRawImpl(this,message,field);
      this = (Reflection *)internal::MapFieldBase::MutableRepeatedField(this_00);
    }
    else {
      VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(this,field);
      this = (Reflection *)MutableRawImpl(this,message,field);
    }
    pVVar5 = internal::RepeatedPtrFieldBase::
             AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                       ((RepeatedPtrFieldBase *)this);
    if (pVVar5 != (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_>
                   *)0x0) {
      return pVVar5;
    }
    if (*(int *)&(this->schema_).default_instance_ == 0) {
      pDVar7 = FieldDescriptor::message_type(field);
      iVar4 = (*factory->_vptr_MessageFactory[2])(factory,pDVar7);
      pMVar6 = (MessageLite *)CONCAT44(extraout_var,iVar4);
    }
    else {
      pMVar6 = &internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                          ((RepeatedPtrFieldBase *)this,0)->super_MessageLite;
    }
    arena = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)arena & 1) == 0) goto LAB_0025b5e1;
  }
  else {
    arena = (Arena *)0x0;
    AddMessage();
    pMVar6 = extraout_RAX;
  }
  arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
LAB_0025b5e1:
  pMVar6 = MessageLite::New(pMVar6,arena);
  internal::RepeatedPtrFieldBase::
  UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            ((RepeatedPtrFieldBase *)this,
             (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *)
             pMVar6);
  return (Message *)pMVar6;
}

Assistant:

Message* Reflection::AddMessage(Message* message, const FieldDescriptor* field,
                                MessageFactory* factory) const {
  USAGE_MUTABLE_CHECK_ALL(AddMessage, REPEATED, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->AddMessage(field, factory));
  } else {
    Message* result = nullptr;

    // We can't use AddField<Message>() because RepeatedPtrFieldBase doesn't
    // know how to allocate one.
    RepeatedPtrFieldBase* repeated = nullptr;
    if (IsMapFieldInApi(field)) {
      repeated =
          MutableRaw<MapFieldBase>(message, field)->MutableRepeatedField();
    } else {
      repeated = MutableRaw<RepeatedPtrFieldBase>(message, field);
    }
    result = repeated->AddFromCleared<GenericTypeHandler<Message> >();
    if (result == nullptr) {
      // We must allocate a new object.
      const Message* prototype;
      if (repeated->size() == 0) {
        prototype = factory->GetPrototype(field->message_type());
      } else {
        prototype = &repeated->Get<GenericTypeHandler<Message> >(0);
      }
      result = prototype->New(message->GetArena());
      // We can guarantee here that repeated and result are either both heap
      // allocated or arena owned. So it is safe to call the unsafe version
      // of AddAllocated.
      repeated->UnsafeArenaAddAllocated<GenericTypeHandler<Message> >(result);
    }

    return result;
  }
}